

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_handler.cpp
# Opt level: O3

bool __thiscall
duckdb::PragmaHandler::HandlePragma
          (PragmaHandler *this,SQLStatement *statement,string *resulting_query)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  pragma_query_t p_Var1;
  PragmaStatement *pPVar2;
  Binder *info;
  QueryErrorContext error_context;
  pointer pBVar3;
  pointer *__ptr;
  shared_ptr<duckdb::Binder,_true> binder;
  __alloc_node_gen_t __alloc_node_gen;
  FunctionParameters parameters;
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  undefined1 local_90 [32];
  undefined1 local_70 [64];
  __buckets_ptr pp_Stack_30;
  __node_base_ptr local_28;
  
  pPVar2 = SQLStatement::Cast<duckdb::PragmaStatement>(statement);
  unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator->
            (&pPVar2->info);
  PragmaInfo::Copy((PragmaInfo *)(local_b8 + 8));
  optional_idx::optional_idx((optional_idx *)(local_a8 + 0x10),statement->stmt_location);
  Binder::CreateBinder
            ((Binder *)local_a8,this->context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER
            );
  info = shared_ptr<duckdb::Binder,_true>::operator->((shared_ptr<duckdb::Binder,_true> *)local_a8);
  error_context.query_location.index =
       (optional_idx)
       unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator*
                 ((unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true> *)
                  (local_b8 + 8));
  Binder::BindPragma((Binder *)local_b8,(PragmaInfo *)info,error_context);
  pBVar3 = unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>::
           operator->((unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
                       *)local_b8);
  p_Var1 = (pBVar3->function).query;
  if (p_Var1 != (pragma_query_t)0x0) {
    pBVar3 = unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
             ::operator->((unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
                           *)local_b8);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_70,
               &(pBVar3->parameters).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
    pBVar3 = unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
             ::operator->((unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
                           *)local_b8);
    this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(local_70 + 0x18);
    local_70._24_8_ = (_Hash_node_base *)0x0;
    local_70._32_8_ = (pBVar3->named_parameters)._M_h._M_bucket_count;
    local_70._40_8_ = (_Hash_node_base *)0x0;
    local_70._48_8_ = (pBVar3->named_parameters)._M_h._M_element_count;
    local_70._56_8_ = *(undefined8 *)&(pBVar3->named_parameters)._M_h._M_rehash_policy;
    pp_Stack_30 = (__buckets_ptr)(pBVar3->named_parameters)._M_h._M_rehash_policy._M_next_resize;
    local_28 = (__node_base_ptr)0x0;
    local_90._0_8_ = this_00;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::Value>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00,&(pBVar3->named_parameters)._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
                *)(local_a8 + 0x18));
    pBVar3 = unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
             ::operator->((unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
                           *)local_b8);
    (*(pBVar3->function).query)
              ((string *)(local_a8 + 0x18),this->context,(FunctionParameters *)local_70);
    ::std::__cxx11::string::operator=((string *)resulting_query,(string *)(local_a8 + 0x18));
    if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)local_90._0_8_ !=
        (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(this_00);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_70);
  }
  if ((_Tuple_impl<0UL,_duckdb::BoundPragmaInfo_*,_std::default_delete<duckdb::BoundPragmaInfo>_>)
      local_b8._0_8_ != (BoundPragmaInfo *)0x0) {
    ::std::default_delete<duckdb::BoundPragmaInfo>::operator()
              ((default_delete<duckdb::BoundPragmaInfo> *)local_b8,(BoundPragmaInfo *)local_b8._0_8_
              );
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_b8._8_8_)[1])();
  }
  return p_Var1 != (pragma_query_t)0x0;
}

Assistant:

bool PragmaHandler::HandlePragma(SQLStatement &statement, string &resulting_query) {
	auto info = statement.Cast<PragmaStatement>().info->Copy();
	QueryErrorContext error_context(statement.stmt_location);
	auto binder = Binder::CreateBinder(context);
	auto bound_info = binder->BindPragma(*info, error_context);
	if (bound_info->function.query) {
		FunctionParameters parameters {bound_info->parameters, bound_info->named_parameters};
		resulting_query = bound_info->function.query(context, parameters);
		return true;
	}
	return false;
}